

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type __thiscall
fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
operator()(printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
           *this,char value)

{
  long lVar1;
  type tVar2;
  
  lVar1 = *(long *)(this + 0x10);
  if ((*(char *)(lVar1 + 0x11) != '\0') && (*(char *)(lVar1 + 0x11) != 'c')) {
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)this,(int)value);
    return (type)tVar2.container;
  }
  *(undefined1 *)(lVar1 + 0x10) = 0;
  *(undefined4 *)(lVar1 + 8) = 2;
  tVar2 = internal::
          arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
          operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                      *)this,value);
  return (type)tVar2.container;
}

Assistant:

format_specs *spec() { return specs_; }